

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

char * lj_str_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  byte bVar1;
  TValue *pTVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  char *pcVar7;
  uint *puVar8;
  long *plVar9;
  cTValue *pcVar10;
  int *piVar11;
  ulong *puVar12;
  size_t sVar13;
  ulong uVar14;
  GCstr *pGVar15;
  MSize MVar16;
  ulong uVar17;
  int c;
  uint uVar18;
  byte *pbVar19;
  long lVar20;
  ulong uVar21;
  char *s;
  TValue tv;
  char buf [11];
  cTValue local_60;
  byte local_58 [9];
  byte local_4f [31];
  
  uVar21 = (ulong)(L->glref).ptr32;
  sVar5 = strlen(fmt);
  uVar4 = (uint)sVar5;
  if (*(uint *)(uVar21 + 100) < uVar4) {
    MVar16 = 0x20;
    if (0x20 < uVar4) {
      MVar16 = uVar4;
    }
    pvVar6 = lj_mem_realloc(L,*(void **)(uVar21 + 0x58),*(uint *)(uVar21 + 100),MVar16);
    *(void **)(uVar21 + 0x58) = pvVar6;
    *(MSize *)(uVar21 + 100) = MVar16;
  }
  sb = (SBuf *)(uVar21 + 0x58);
  *(undefined4 *)(uVar21 + 0x60) = 0;
  do {
    pcVar7 = strchr(fmt,0x25);
    if (pcVar7 != (char *)0x0) {
      addstr(L,sb,fmt,(int)pcVar7 - (int)fmt);
      bVar1 = pcVar7[1];
      if (bVar1 < 0x66) {
        if (bVar1 == 0x25) {
          c = 0x25;
        }
        else if (bVar1 == 99) {
          uVar4 = argp->gp_offset;
          if ((ulong)uVar4 < 0x29) {
            piVar11 = (int *)((ulong)uVar4 + (long)argp->reg_save_area);
            argp->gp_offset = uVar4 + 8;
          }
          else {
            piVar11 = (int *)argp->overflow_arg_area;
            argp->overflow_arg_area = piVar11 + 2;
          }
          c = *piVar11;
        }
        else {
          if (bVar1 == 100) {
            uVar4 = argp->gp_offset;
            if ((ulong)uVar4 < 0x29) {
              puVar8 = (uint *)((ulong)uVar4 + (long)argp->reg_save_area);
              argp->gp_offset = uVar4 + 8;
            }
            else {
              puVar8 = (uint *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar8 + 2;
            }
            uVar4 = *puVar8;
            uVar18 = -uVar4;
            if (0 < (int)uVar4) {
              uVar18 = uVar4;
            }
            pbVar19 = local_4f + 1;
            do {
              s = (char *)pbVar19;
              *s = (char)uVar18 + (char)(uVar18 / 10) * -10 | 0x30;
              pbVar19 = (byte *)s + -1;
              bVar3 = 9 < uVar18;
              uVar18 = uVar18 / 10;
            } while (bVar3);
            if ((int)uVar4 < 0) {
              *pbVar19 = 0x2d;
              s = (char *)pbVar19;
            }
            MVar16 = ((int)local_4f + 2) - (int)s;
            goto LAB_00109621;
          }
LAB_0010946d:
          addchar(L,sb,0x25);
          c = (int)pcVar7[1];
        }
        addchar(L,sb,c);
      }
      else {
        if (bVar1 == 0x66) {
          uVar4 = argp->fp_offset;
          if ((ulong)uVar4 < 0xa1) {
            pcVar10 = (cTValue *)((ulong)uVar4 + (long)argp->reg_save_area);
            argp->fp_offset = uVar4 + 0x10;
          }
          else {
            pcVar10 = (cTValue *)argp->overflow_arg_area;
            argp->overflow_arg_area = pcVar10 + 1;
          }
          local_60 = *pcVar10;
          s = (char *)local_58;
          sVar13 = lj_str_bufnum(s,&local_60);
          MVar16 = (MSize)sVar13;
        }
        else if (bVar1 == 0x70) {
          uVar4 = argp->gp_offset;
          if ((ulong)uVar4 < 0x29) {
            puVar12 = (ulong *)((ulong)uVar4 + (long)argp->reg_save_area);
            argp->gp_offset = uVar4 + 8;
          }
          else {
            puVar12 = (ulong *)argp->overflow_arg_area;
            argp->overflow_arg_area = puVar12 + 1;
          }
          uVar14 = *puVar12;
          if (uVar14 == 0) {
            s = "NULL";
            MVar16 = 4;
          }
          else {
            uVar17 = 10;
            if (uVar14 >> 0x20 != 0) {
              uVar4 = 0x1f;
              uVar18 = (uint)(uVar14 >> 0x20);
              if (uVar18 != 0) {
                for (; uVar18 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                }
              }
              uVar17 = (ulong)((uVar4 >> 2 & 6) + 0xc);
            }
            MVar16 = (MSize)uVar17;
            local_58[0] = 0x30;
            local_58[1] = 0x78;
            lVar20 = uVar17 + 1;
            do {
              local_58[lVar20 + -2] = "0123456789abcdef"[(uint)uVar14 & 0xf];
              uVar14 = (long)uVar14 >> 4;
              lVar20 = lVar20 + -1;
            } while (3 < lVar20);
            s = (char *)local_58;
          }
        }
        else {
          if (bVar1 != 0x73) goto LAB_0010946d;
          uVar4 = argp->gp_offset;
          if ((ulong)uVar4 < 0x29) {
            plVar9 = (long *)((ulong)uVar4 + (long)argp->reg_save_area);
            argp->gp_offset = uVar4 + 8;
          }
          else {
            plVar9 = (long *)argp->overflow_arg_area;
            argp->overflow_arg_area = plVar9 + 1;
          }
          s = (char *)*plVar9;
          if ((byte *)s == (byte *)0x0) {
            s = "(null)";
          }
          sVar5 = strlen(s);
          MVar16 = (MSize)sVar5;
        }
LAB_00109621:
        addstr(L,sb,s,MVar16);
      }
      fmt = pcVar7 + 2;
    }
    if (pcVar7 == (char *)0x0) {
      sVar5 = strlen(fmt);
      addstr(L,sb,fmt,(MSize)sVar5);
      pTVar2 = L->top;
      pGVar15 = lj_str_new(L,*(char **)(uVar21 + 0x58),(ulong)*(uint *)(uVar21 + 0x60));
      (pTVar2->u32).lo = (uint32_t)pGVar15;
      (pTVar2->field_2).it = 0xfffffffb;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar2 + 1) {
        lj_state_growstack(L,1);
      }
      return (char *)((ulong)L->top[-1].u32.lo + 0x10);
    }
  } while( true );
}

Assistant:

const char *lj_str_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = &G(L)->tmpbuf;
  lj_str_needbuf(L, sb, (MSize)strlen(fmt));
  lj_str_resetbuf(sb);
  for (;;) {
    const char *e = strchr(fmt, '%');
    if (e == NULL) break;
    addstr(L, sb, fmt, (MSize)(e-fmt));
    /* This function only handles %s, %c, %d, %f and %p formats. */
    switch (e[1]) {
    case 's': {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      addstr(L, sb, s, (MSize)strlen(s));
      break;
      }
    case 'c':
      addchar(L, sb, va_arg(argp, int));
      break;
    case 'd': {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, va_arg(argp, int32_t));
      addstr(L, sb, p, (MSize)(buf+LJ_STR_INTBUF-p));
      break;
      }
    case 'f': {
      char buf[LJ_STR_NUMBUF];
      TValue tv;
      MSize len;
      tv.n = (lua_Number)(va_arg(argp, LUAI_UACNUMBER));
      len = (MSize)lj_str_bufnum(buf, &tv);
      addstr(L, sb, buf, len);
      break;
      }
    case 'p': {
#define FMTP_CHARS	(2*sizeof(ptrdiff_t))
      char buf[2+FMTP_CHARS];
      ptrdiff_t p = (ptrdiff_t)(va_arg(argp, void *));
      ptrdiff_t i, lasti = 2+FMTP_CHARS;
      if (p == 0) {
	addstr(L, sb, "NULL", 4);
	break;
      }
#if LJ_64
      /* Shorten output for 64 bit pointers. */
      lasti = 2+2*4+((p >> 32) ? 2+2*(lj_fls((uint32_t)(p >> 32))>>3) : 0);
#endif
      buf[0] = '0';
      buf[1] = 'x';
      for (i = lasti-1; i >= 2; i--, p >>= 4)
	buf[i] = "0123456789abcdef"[(p & 15)];
      addstr(L, sb, buf, (MSize)lasti);
      break;
      }
    case '%':
      addchar(L, sb, '%');
      break;
    default:
      addchar(L, sb, '%');
      addchar(L, sb, e[1]);
      break;
    }
    fmt = e+2;
  }
  addstr(L, sb, fmt, (MSize)strlen(fmt));
  setstrV(L, L->top, lj_str_new(L, sb->buf, sb->n));
  incr_top(L);
  return strVdata(L->top - 1);
}